

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

ssize_t cf_h2_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  uint uVar1;
  HTTP *pHVar2;
  stream_ctx *stream;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  CURLcode CVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong size;
  
  if (((data == (Curl_easy *)0x0) || (pHVar2 = (data->req).p.http, pHVar2 == (HTTP *)0x0)) ||
     (stream = (stream_ctx *)pHVar2->h2_ctx, stream == (stream_ctx *)0x0)) {
    Curl_failf(data,"[%zd-%zd], http/2 recv on a transfer never opened or already cleared",data->id,
               cf->conn->connection_id);
    *err = CURLE_HTTP2;
    return -1;
  }
  puVar3 = (undefined8 *)cf->ctx;
  uVar4 = puVar3[2];
  puVar3[2] = data;
  uVar10 = stream_recv(cf,data,stream,buf,len,err);
  if ((long)uVar10 < 0) {
    if (*err != CURLE_AGAIN) goto LAB_007104c1;
    CVar6 = h2_progress_ingress(cf,data);
    *err = CVar6;
    if (CVar6 != CURLE_OK) goto LAB_007104c1;
    uVar10 = stream_recv(cf,data,stream,buf,len,err);
  }
  if ((long)uVar10 < 1) goto LAB_007104c1;
  uVar5 = stream->resp_hds_len;
  if (uVar5 < uVar10) {
    size = uVar10;
    if (uVar5 != 0) {
      stream->resp_hds_len = 0;
      size = uVar10 - uVar5;
      if (size == 0) goto LAB_00710480;
    }
    nghttp2_session_consume((nghttp2_session *)*puVar3,stream->id,size);
  }
  else {
    stream->resp_hds_len = uVar5 - uVar10;
  }
LAB_00710480:
  if (stream->closed == true) {
    if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[%d] DRAIN closed stream",(ulong)(uint)stream->id);
    }
    drain_stream(cf,data,stream);
  }
LAB_007104c1:
  CVar6 = h2_progress_egress(cf,data);
  if (CVar6 != CURLE_OK) {
    if (CVar6 == CURLE_AGAIN) {
      drain_stream(cf,data,stream);
    }
    else {
      *err = CVar6;
      uVar10 = 0xffffffffffffffff;
    }
  }
  if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
    uVar1 = stream->id;
    CVar6 = *err;
    sVar11 = Curl_bufq_len(&stream->recvbuf);
    uVar7 = nghttp2_session_get_stream_effective_recv_data_length
                      ((nghttp2_session *)*puVar3,stream->id);
    uVar8 = nghttp2_session_get_stream_effective_local_window_size
                      ((nghttp2_session *)*puVar3,stream->id);
    uVar9 = nghttp2_session_get_local_window_size((nghttp2_session *)*puVar3);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_recv(len=%zu) -> %zd %d, buffered=%zu, window=%d/%d, connection %d/%d"
                      ,(ulong)uVar1,len,uVar10,(ulong)CVar6,sVar11,(ulong)uVar7,(ulong)uVar8,
                      (ulong)uVar9,0x3e800000);
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar4;
  return uVar10;
}

Assistant:

static ssize_t cf_h2_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                          char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  ssize_t nread = -1;
  CURLcode result;
  struct cf_call_data save;

  if(!stream) {
    /* Abnormal call sequence: either this transfer has never opened a stream
     * (unlikely) or the transfer has been done, cleaned up its resources, but
     * a read() is called anyway. It is not clear what the calling sequence
     * is for such a case. */
    failf(data, "[%zd-%zd], http/2 recv on a transfer never opened "
          "or already cleared", (ssize_t)data->id,
          (ssize_t)cf->conn->connection_id);
    *err = CURLE_HTTP2;
    return -1;
  }

  CF_DATA_SAVE(save, cf, data);

  nread = stream_recv(cf, data, stream, buf, len, err);
  if(nread < 0 && *err != CURLE_AGAIN)
    goto out;

  if(nread < 0) {
    *err = h2_progress_ingress(cf, data);
    if(*err)
      goto out;

    nread = stream_recv(cf, data, stream, buf, len, err);
  }

  if(nread > 0) {
    size_t data_consumed = (size_t)nread;
    /* Now that we transferred this to the upper layer, we report
     * the actual amount of DATA consumed to the H2 session, so
     * that it adjusts stream flow control */
    if(stream->resp_hds_len >= data_consumed) {
      stream->resp_hds_len -= data_consumed;  /* no DATA */
    }
    else {
      if(stream->resp_hds_len) {
        data_consumed -= stream->resp_hds_len;
        stream->resp_hds_len = 0;
      }
      if(data_consumed) {
        nghttp2_session_consume(ctx->h2, stream->id, data_consumed);
      }
    }

    if(stream->closed) {
      CURL_TRC_CF(data, cf, "[%d] DRAIN closed stream", stream->id);
      drain_stream(cf, data, stream);
    }
  }

out:
  result = h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    /* pending data to send, need to be called again. Ideally, we'd
     * monitor the socket for POLLOUT, but we might not be in SENDING
     * transfer state any longer and are unable to make this happen.
     */
    drain_stream(cf, data, stream);
  }
  else if(result) {
    *err = result;
    nread = -1;
  }
  CURL_TRC_CF(data, cf, "[%d] cf_recv(len=%zu) -> %zd %d, "
              "buffered=%zu, window=%d/%d, connection %d/%d",
              stream->id, len, nread, *err,
              Curl_bufq_len(&stream->recvbuf),
              nghttp2_session_get_stream_effective_recv_data_length(
                ctx->h2, stream->id),
              nghttp2_session_get_stream_effective_local_window_size(
                ctx->h2, stream->id),
              nghttp2_session_get_local_window_size(ctx->h2),
              HTTP2_HUGE_WINDOW_SIZE);

  CF_DATA_RESTORE(cf, save);
  return nread;
}